

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_seg_t * ps_astar_seg_next(ps_seg_t *seg)

{
  astar_seg_t *itor;
  ps_seg_t *seg_local;
  
  *(int *)((long)&seg[1].search + 4) = *(int *)((long)&seg[1].search + 4) + 1;
  if (*(int *)((long)&seg[1].search + 4) == *(int *)&seg[1].search) {
    ps_astar_seg_free(seg);
    seg_local = (ps_seg_t *)0x0;
  }
  else {
    ps_astar_node2itor((astar_seg_t *)seg);
    seg_local = seg;
  }
  return seg_local;
}

Assistant:

static ps_seg_t *
ps_astar_seg_next(ps_seg_t *seg)
{
    astar_seg_t *itor = (astar_seg_t *)seg;

    ++itor->cur;
    if (itor->cur == itor->n_nodes) {
        ps_astar_seg_free(seg);
        return NULL;
    }
    else {
        ps_astar_node2itor(itor);
    }

    return seg;
}